

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

SecretMatch __thiscall
duckdb::SecretStorage::SelectBestMatch
          (SecretStorage *this,SecretEntry *secret_entry,string *path,int64_t offset,
          SecretMatch *current_best)

{
  bool bVar1;
  int iVar2;
  pointer pBVar3;
  undefined4 extraout_var;
  BaseSecret *pBVar4;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t iVar5;
  pointer pcVar6;
  SecretMatch SVar7;
  
  pBVar3 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(&secret_entry->secret);
  iVar2 = (*pBVar3->_vptr_BaseSecret[2])(pBVar3,path);
  pcVar6 = (pointer)(CONCAT44(extraout_var,iVar2) * 100 - offset);
  if ((long)current_best->score < (long)pcVar6) {
LAB_0144a206:
    make_uniq<duckdb::SecretEntry,duckdb::SecretEntry&>((duckdb *)this,secret_entry);
    (this->storage_name)._M_dataplus._M_p = pcVar6;
    iVar5 = extraout_RDX_00;
  }
  else {
    if (pcVar6 == (pointer)current_best->score) {
      pBVar3 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&secret_entry->secret);
      pBVar4 = SecretMatch::GetSecret(current_best);
      bVar1 = ::std::operator<(&pBVar3->name,&pBVar4->name);
      if (bVar1) goto LAB_0144a206;
    }
    SecretMatch::SecretMatch((SecretMatch *)this,current_best);
    iVar5 = extraout_RDX;
  }
  SVar7.score = iVar5;
  SVar7.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
  return SVar7;
}

Assistant:

SecretMatch SecretStorage::SelectBestMatch(SecretEntry &secret_entry, const string &path, int64_t offset,
                                           SecretMatch &current_best) {
	// Get secret match score
	auto match_score = secret_entry.secret->MatchScore(path);

	// On no match
	if (match_score == NumericLimits<int64_t>::Minimum()) {
		return current_best;
	}

	// The number of characters that match, where 0 means matching the catchall of "*"
	D_ASSERT(match_score >= 0);

	// Apply storage tie-break offset
	match_score = 100 * match_score - offset;

	// Choose the best matching score, tie-breaking on secret name when necessary
	if (match_score > current_best.score) {
		return SecretMatch(secret_entry, match_score);
	} else if (match_score == current_best.score &&
	           secret_entry.secret->GetName() < current_best.GetSecret().GetName()) {
		return SecretMatch(secret_entry, match_score);
	} else {
		return current_best;
	}
}